

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O1

void ctype_prepqual(CTRepr *ctr,CTInfo info)

{
  char *pcVar1;
  long lVar2;
  
  if ((info >> 0x18 & 1) != 0) {
    pcVar1 = ctr->pb;
    if (pcVar1 < ctr->buf + 9) {
      ctr->ok = 0;
    }
    else {
      if (ctr->needsp != 0) {
        pcVar1[-1] = ' ';
        pcVar1 = pcVar1 + -1;
      }
      ctr->needsp = 1;
      lVar2 = 0;
      do {
        pcVar1[lVar2 + -1] = "volatile"[lVar2 + 7];
        lVar2 = lVar2 + -1;
      } while (lVar2 != -8);
      ctr->pb = pcVar1 + -8;
    }
  }
  if ((info >> 0x19 & 1) != 0) {
    pcVar1 = ctr->pb;
    if (pcVar1 < ctr->buf + 6) {
      ctr->ok = 0;
      return;
    }
    if (ctr->needsp != 0) {
      pcVar1[-1] = ' ';
      pcVar1 = pcVar1 + -1;
    }
    ctr->needsp = 1;
    lVar2 = 0;
    do {
      pcVar1[lVar2 + -1] = "const"[lVar2 + 4];
      lVar2 = lVar2 + -1;
    } while (lVar2 != -5);
    ctr->pb = pcVar1 + -5;
  }
  return;
}

Assistant:

static void ctype_prepqual(CTRepr *ctr, CTInfo info)
{
  if ((info & CTF_VOLATILE)) ctype_preplit(ctr, "volatile");
  if ((info & CTF_CONST)) ctype_preplit(ctr, "const");
}